

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

CartesianSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (CartesianSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos)

{
  Vector3d local_180;
  tuple<double,_double,_double> local_168;
  ScreenEdgeLock local_150;
  double *local_100;
  double *local_f8;
  CartesianSpeakerPosition *local_f0;
  CartesianSpeakerPosition local_e8;
  
  CartesianSpeakerPosition::CartesianSpeakerPosition(&local_e8,pos);
  toCartesianVector3d(&local_e8);
  ScreenEdgeLock::ScreenEdgeLock(&local_150,&pos->screenEdgeLock);
  ScreenEdgeLockHandler::handleVector
            (&local_168,&this->_screenEdgeLockHandler,&local_180,&local_150);
  local_f8 = &pos->Y;
  local_100 = &pos->Z;
  local_f0 = pos;
  std::tuple<double&,double&,double&>::operator=
            ((tuple<double&,double&,double&> *)&local_100,&local_168);
  ScreenEdgeLock::~ScreenEdgeLock(&local_150);
  ScreenEdgeLock::~ScreenEdgeLock(&local_e8.screenEdgeLock);
  CartesianSpeakerPosition::CartesianSpeakerPosition(__return_storage_ptr__,pos);
  return __return_storage_ptr__;
}

Assistant:

CartesianSpeakerPosition
  GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      CartesianSpeakerPosition pos) {
    std::tie(pos.X, pos.Y, pos.Z) = _screenEdgeLockHandler.handleVector(
        toCartesianVector3d(pos), pos.screenEdgeLock);
    return pos;
  }